

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int local_4034;
  int local_4030;
  int i_1;
  int j;
  int n;
  test *tests [1024];
  int local_2020;
  int local_201c;
  int i;
  int tests_to_runc;
  test *tests_to_run [1024];
  char **argv_local;
  int argc_local;
  
  tests_to_run[0x3ff] = (test *)argv;
  memset(&i,0,0x2000);
  local_201c = 0;
  if (argc < 2) {
    for (local_4034 = 0; local_4034 < test_count; local_4034 = local_4034 + 1) {
      *(test **)(&i + (long)local_201c * 2) = ::tests + local_4034;
      local_201c = local_201c + 1;
    }
  }
  else {
    for (local_2020 = 1; local_2020 < argc; local_2020 = local_2020 + 1) {
      memset(&j,0,0x2000);
      i_1 = 0x400;
      search_tests(*(char **)(tests_to_run[0x3ff]->reason + (long)local_2020 * 8 + -0x20),
                   (test **)&j,&i_1);
      if (i_1 == 0) {
        fprintf(_stderr,"WARN: No tests matching \"%s\" found.\n",
                *(undefined8 *)(tests_to_run[0x3ff]->reason + (long)local_2020 * 8 + -0x20));
      }
      else {
        for (local_4030 = 0; local_4030 < i_1; local_4030 = local_4030 + 1) {
          *(undefined8 *)(&i + (long)local_201c * 2) = *(undefined8 *)(&j + (long)local_4030 * 2);
          local_201c = local_201c + 1;
        }
      }
    }
  }
  iVar1 = run_tests((test **)&i,local_201c);
  return (int)((iVar1 != 0 ^ 0xffU) & 1);
}

Assistant:

int main(int argc, char *argv[]){
  struct test *tests_to_run[MAX_TESTS] = {0};
  int tests_to_runc = 0;
  if(1 < argc){
    for(int i=1; i<argc; ++i){
      struct test *tests[MAX_TESTS] = {0};
      int n = MAX_TESTS;
      search_tests(argv[i], tests, &n);
      if(n==0) fprintf(stderr, "WARN: No tests matching \"%s\" found.\n", argv[i]);
      else for(int j=0; j<n; ++j)
             tests_to_run[tests_to_runc++] = tests[j];
    }
  }else{
    for(int i=0; i<test_count; ++i){
      tests_to_run[tests_to_runc++] = &tests[i];
    }
  }

  return !run_tests(tests_to_run, tests_to_runc);
}